

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O1

bool kj::_::expectFatalThrow
               (Maybe<kj::Exception::Type> *type,Maybe<kj::StringPtr> *message,
               Function<void_()> *code)

{
  bool bVar1;
  __pid_t __pid;
  int iVar2;
  __pid_t _Var3;
  uint uVar4;
  Exception *e;
  anon_union_4_1_a8c68091_for_NullableValue<kj::Exception::Type>_2 aVar5;
  bool bVar6;
  FatalThrowExpectation expectation;
  Fault f;
  NullableValue<kj::Exception> _e110;
  int status;
  ExceptionCallback local_548;
  char local_538;
  anon_union_4_1_a8c68091_for_NullableValue<kj::Exception::Type>_2 local_534;
  char local_530;
  undefined4 local_528;
  undefined4 uStack_524;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  Fault local_500 [51];
  undefined8 local_368;
  Exception EStack_360;
  uint local_1c8 [102];
  
  do {
    __pid = fork();
    if (-1 < __pid) {
      iVar2 = 0;
      break;
    }
    iVar2 = Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_500[0].exception = (Exception *)0x0;
    local_368 = 0;
    EStack_360.ownFile.content.ptr = (char *)0x0;
    Debug::Fault::init(local_500,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                      );
    Debug::Fault::fatal(local_500);
  }
  if (__pid == 0) {
    bVar6 = (type->ptr).isSet;
    aVar5.value = FAILED;
    if (bVar6 == true) {
      aVar5 = (type->ptr).field_1;
    }
    bVar1 = (message->ptr).isSet;
    if (bVar1 == true) {
      local_518 = *(undefined8 *)&(message->ptr).field_1;
      uStack_510 = *(undefined8 *)((long)&(message->ptr).field_1 + 8);
    }
    ExceptionCallback::ExceptionCallback(&local_548);
    local_548._vptr_ExceptionCallback = (_func_int **)&PTR__FatalThrowExpectation_00239c50;
    if (bVar6 != false) {
      local_534 = aVar5;
    }
    if (bVar1 != false) {
      local_528 = (undefined4)local_518;
      uStack_524 = local_518._4_4_;
      uStack_520 = (undefined4)uStack_510;
      uStack_51c = uStack_510._4_4_;
    }
    local_538 = bVar6;
    local_530 = bVar1;
    (**((code->impl).ptr)->_vptr_Iface)();
    local_500[0].exception = local_500[0].exception & 0xffffffffffffff00;
    local_368 = local_368 & 0xffffffffffffff00;
    if (Debug::minSeverity < 3) {
      Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                 ,0x71,ERROR,"\"no fatal exception was thrown\"",
                 (char (*) [30])"no fatal exception was thrown");
    }
    if ((char)local_368 == '\x01') {
      Exception::~Exception(&EStack_360);
    }
    local_548._vptr_ExceptionCallback = (_func_int **)&PTR__FatalThrowExpectation_00239c50;
    ExceptionCallback::~ExceptionCallback(&local_548);
    _exit(1);
  }
  do {
    _Var3 = waitpid(__pid,(int *)local_1c8,0);
    if (-1 < _Var3) {
      iVar2 = 0;
      break;
    }
    uVar4 = Debug::getOsErrorNumber(false);
    code = (Function<void_()> *)((ulong)code & 0xffffffff);
    if (uVar4 != 0xffffffff) {
      code = (Function<void_()> *)(ulong)uVar4;
    }
    iVar2 = (int)code;
  } while (uVar4 == 0xffffffff);
  if (iVar2 != 0) {
    local_500[0].exception = (Exception *)0x0;
    local_368 = 0;
    EStack_360.ownFile.content.ptr = (char *)0x0;
    Debug::Fault::init(local_500,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                      );
    Debug::Fault::fatal(local_500);
  }
  if ((local_1c8[0] & 0x7f) == 0) {
    bVar6 = (local_1c8[0] & 0xff00) == 0;
  }
  else {
    if ((int)((local_1c8[0] & 0x7f) * 0x1000000 + 0x1000000) < 0x2000000) {
      if (Debug::minSeverity < 3) {
        Debug::log<char_const(&)[39],int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                   ,0x7e,ERROR,"\"subprocess neither exited nor crashed?\", status",
                   (char (*) [39])"subprocess neither exited nor crashed?",(int *)local_1c8);
      }
    }
    else if (Debug::minSeverity < 3) {
      local_368 = CONCAT44(local_368._4_4_,local_1c8[0]) & 0xffffffff0000007f;
      Debug::log<char_const(&)[46],int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                 ,0x7b,ERROR,"\"subprocess crashed without throwing exception\", WTERMSIG(status)",
                 (char (*) [46])"subprocess crashed without throwing exception",(int *)&local_368);
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool expectFatalThrow(kj::Maybe<Exception::Type> type, kj::Maybe<StringPtr> message,
                      Function<void()> code) {
#if _WIN32
  // We don't support death tests on Windows due to lack of efficient fork.
  return true;
#else
  pid_t child;
  KJ_SYSCALL(child = fork());
  if (child == 0) {
    KJ_DEFER(_exit(1));
    FatalThrowExpectation expectation(type, message);
    KJ_IF_SOME(e, kj::runCatchingExceptions([&]() {
      code();
    })) {
      KJ_LOG(ERROR, "a non-fatal exception was thrown, but we expected fatal", e);
    } else {
      KJ_LOG(ERROR, "no fatal exception was thrown");
    }
  }

  int status;
  KJ_SYSCALL(waitpid(child, &status, 0));

  if (WIFEXITED(status)) {
    return WEXITSTATUS(status) == 0;
  } else if (WIFSIGNALED(status)) {
    KJ_FAIL_EXPECT("subprocess crashed without throwing exception", WTERMSIG(status));
    return false;
  } else {
    KJ_FAIL_EXPECT("subprocess neither exited nor crashed?", status);
    return false;
  }
#endif
}